

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeparser.cpp
# Opt level: O3

void __thiscall
QMakeParser::finalizeCond(QMakeParser *this,ushort **tokPtr,ushort *uc,ushort *ptr,int wordCount)

{
  ushort *puVar1;
  bool bVar2;
  int iVar3;
  undefined2 *puVar4;
  iterator iVar5;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (wordCount != 0) {
    if (wordCount != 1) {
      QVar6.m_data = (storage_type *)0x27;
      QVar6.m_size = (qsizetype)&local_48;
      QString::fromLatin1(QVar6);
      bogusTest(this,tokPtr,&local_48);
      goto LAB_002931e9;
    }
    if ((*uc == 9) && (uc + (ulong)uc[3] + 4 == ptr)) {
      QString::setRawData((QChar *)&this->m_tmp,(longlong)(uc + 4));
      iVar3 = QString::compare((QString *)&this->m_tmp,0x2e5850);
      if (iVar3 == 0) {
        bVar2 = failOperator(this,"in front of else");
        if (!bVar2) {
          iVar5 = QList<QMakeParser::BlockScope>::end
                            (&(this->m_blockstack).super_QList<QMakeParser::BlockScope>);
          if ((this->m_canElse != true) ||
             ((iVar5.i[-1].special == true && (iVar5.i[-1].braceLevel == 0)))) {
            do {
              iVar5 = QList<QMakeParser::BlockScope>::end
                                (&(this->m_blockstack).super_QList<QMakeParser::BlockScope>);
              if (iVar5.i[-1].inBranch == true) {
                if ((iVar5.i[-1].special != true) || (iVar5.i[-1].braceLevel != 0)) {
                  iVar5.i[-1].inBranch = false;
                  goto LAB_002932e2;
                }
              }
              else if (iVar5.i[-1].braceLevel != 0) goto LAB_00293290;
              if ((this->m_blockstack).super_QList<QMakeParser::BlockScope>.d.size == 1)
              goto LAB_00293290;
              leaveScope(this,tokPtr);
            } while( true );
          }
          puVar1 = *tokPtr;
          puVar1[0] = 0x18;
          puVar1[1] = 0;
          *tokPtr = puVar1 + 3;
          puVar1[2] = 0;
LAB_002932e2:
          if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
            enterScope(this,tokPtr,false,StCtrl);
            return;
          }
          goto LAB_00293311;
        }
        goto LAB_00293206;
      }
    }
    finalizeTest(this,tokPtr);
    memcpy(*tokPtr,uc,(long)ptr - (long)uc & 0xffffffff);
    puVar4 = (undefined2 *)((long)*tokPtr + ((long)ptr - (long)uc & 0x1fffffffeU));
    *tokPtr = puVar4 + 1;
    *puVar4 = 0x10;
  }
  goto LAB_00293206;
LAB_00293290:
  QVar7.m_data = (storage_type *)0x12;
  QVar7.m_size = (qsizetype)&local_48;
  QString::fromLatin1(QVar7);
  message(this,0x301,&local_48);
  this->m_proFile->m_ok = false;
LAB_002931e9:
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_00293206:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_00293311:
  __stack_chk_fail();
}

Assistant:

void QMakeParser::finalizeCond(ushort *&tokPtr, ushort *uc, ushort *ptr, int wordCount)
{
    if (wordCount != 1) {
        if (wordCount)
            bogusTest(tokPtr, fL1S("Extra characters after test expression."));
        return;
    }

    // Check for magic tokens
    if (*uc == TokHashLiteral) {
        uint nlen = uc[3];
        ushort *uce = uc + 4 + nlen;
        if (uce == ptr) {
            m_tmp.setRawData((QChar *)uc + 4, nlen);
            if (!m_tmp.compare(statics.strelse, Qt::CaseInsensitive)) {
                if (failOperator("in front of else"))
                    return;
                BlockScope &top = m_blockstack.top();
                if (m_canElse && (!top.special || top.braceLevel)) {
                    // A list of tests (the last one likely with side effects),
                    // but no assignment, scope, etc.
                    putTok(tokPtr, TokBranch);
                    // Put empty then block
                    putBlockLen(tokPtr, 0);
                    enterScope(tokPtr, false, StCtrl);
                    return;
                }
                forever {
                    BlockScope &top = m_blockstack.top();
                    if (top.inBranch && (!top.special || top.braceLevel)) {
                        top.inBranch = false;
                        enterScope(tokPtr, false, StCtrl);
                        return;
                    }
                    if (top.braceLevel || m_blockstack.size() == 1)
                        break;
                    leaveScope(tokPtr);
                }
                parseError(fL1S("Unexpected 'else'."));
                return;
            }
        }
    }